

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

bool __thiscall argparse::Argument::is_decimal_literal(Argument *this,string_view s)

{
  uint uVar1;
  char *pcVar2;
  Argument *pAVar3;
  Argument *pAVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  pbVar6 = (byte *)s._M_len;
  if (this == (Argument *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (uint)*pbVar6;
  }
  if (uVar1 - 0x31 < 9) {
    pcVar2 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argparse::Argument::is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                       (pbVar6,pbVar6 + (long)this,s._M_str);
    pAVar3 = (Argument *)(pcVar2 + -(long)pbVar6);
    pAVar4 = this;
    if (this < pAVar3) goto LAB_0013f734;
    lVar5 = (long)this - (long)pAVar3;
    if (lVar5 == 0) {
      return true;
    }
    pbVar6 = pbVar6 + (long)pAVar3;
LAB_0013f5d4:
    if (lVar5 == 0) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (uint)*pbVar6;
    }
    if ((uVar1 != 0x65) && (uVar1 != 0x45)) {
      if (uVar1 != 0x2e) {
        return false;
      }
      pbVar6 = pbVar6 + 1;
      lVar5 = lVar5 + -1;
      if ((lVar5 != 0) && (pAVar4 = (Argument *)lVar5, *pbVar6 - 0x30 < 10)) goto LAB_0013f65a;
      goto LAB_0013f694;
    }
  }
  else {
    if (uVar1 != 0x2e) {
      if (uVar1 != 0x30) {
        return false;
      }
      pAVar4 = (Argument *)&this[-1].field_0xcf;
      if (pAVar4 == (Argument *)0x0) {
        return true;
      }
      pbVar7 = pbVar6 + 1;
      pcVar2 = std::
               __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argparse::Argument::is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                         (pbVar7,pbVar6 + (long)&this->mNames,s._M_str);
      pAVar3 = (Argument *)(pcVar2 + -(long)pbVar7);
      lVar5 = (long)pAVar4 - (long)pAVar3;
      if (pAVar4 < pAVar3) goto LAB_0013f734;
      pbVar6 = pbVar7 + (long)pAVar3;
      goto LAB_0013f5d4;
    }
    pbVar6 = pbVar6 + 1;
    pAVar4 = (Argument *)&this[-1].field_0xcf;
LAB_0013f65a:
    if (pAVar4 == (Argument *)0x0) {
      return false;
    }
    if (9 < *pbVar6 - 0x30) {
      return false;
    }
    pcVar2 = std::
             __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argparse::Argument::is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                       (pbVar6,pbVar6 + (long)pAVar4);
    pAVar3 = (Argument *)(pcVar2 + -(long)pbVar6);
    lVar5 = (long)pAVar4 - (long)pAVar3;
    if (pAVar4 < pAVar3) goto LAB_0013f734;
    pbVar6 = pbVar6 + (long)pAVar3;
LAB_0013f694:
    if (lVar5 == 0) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (uint)*pbVar6;
    }
    if (uVar1 == 0xffffffff) {
      return true;
    }
    if ((uVar1 != 0x45) && (uVar1 != 0x65)) {
      return false;
    }
  }
  pbVar7 = pbVar6 + 1;
  pAVar4 = (Argument *)(lVar5 + -1);
  if (pAVar4 == (Argument *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (uint)*pbVar7;
  }
  if ((uVar1 == 0x2d) || (uVar1 == 0x2b)) {
    pbVar7 = pbVar6 + 2;
    pAVar4 = (Argument *)(lVar5 + -2);
  }
  if ((pAVar4 == (Argument *)0x0) || (9 < *pbVar7 - 0x30)) {
    return false;
  }
  pcVar2 = std::
           __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argparse::Argument::is_decimal_literal(std::basic_string_view<char,std::char_traits<char>>)::_lambda(auto:1)_1_>>
                     (pbVar7,pbVar7 + (long)pAVar4);
  pAVar3 = (Argument *)(pcVar2 + -(long)pbVar7);
  if (pAVar3 <= pAVar4) {
    return pAVar3 == pAVar4;
  }
LAB_0013f734:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",pAVar3,
             pAVar4);
}

Assistant:

static bool is_decimal_literal(std::string_view s) {
            auto is_digit = [](auto c) constexpr {
                switch (c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9':
                        return true;
                    default:
                        return false;
                }
            };

            // precondition: we have consumed or will consume at least one digit
            auto consume_digits = [=](std::string_view s) {
                auto it = std::find_if_not(std::begin(s), std::end(s), is_digit);
                return s.substr(it - std::begin(s));
            };

            switch (lookahead(s)) {
                case '0': {
                    s.remove_prefix(1);
                    if (s.empty())
                        return true;
                    else
                        goto integer_part;
                }
                case '1':
                case '2':
                case '3':
                case '4':
                case '5':
                case '6':
                case '7':
                case '8':
                case '9': {
                    s = consume_digits(s);
                    if (s.empty())
                        return true;
                    else
                        goto integer_part_consumed;
                }
                case '.': {
                    s.remove_prefix(1);
                    goto post_decimal_point;
                }
                default:
                    return false;
            }

            integer_part:
            s = consume_digits(s);
            integer_part_consumed:
            switch (lookahead(s)) {
                case '.': {
                    s.remove_prefix(1);
                    if (is_digit(lookahead(s)))
                        goto post_decimal_point;
                    else
                        goto exponent_part_opt;
                }
                case 'e':
                case 'E': {
                    s.remove_prefix(1);
                    goto post_e;
                }
                default:
                    return false;
            }

            post_decimal_point:
            if (is_digit(lookahead(s))) {
                s = consume_digits(s);
                goto exponent_part_opt;
            } else {
                return false;
            }

            exponent_part_opt:
            switch (lookahead(s)) {
                case eof:
                    return true;
                case 'e':
                case 'E': {
                    s.remove_prefix(1);
                    goto post_e;
                }
                default:
                    return false;
            }

            post_e:
            switch (lookahead(s)) {
                case '-':
                case '+':
                    s.remove_prefix(1);
            }
            if (is_digit(lookahead(s))) {
                s = consume_digits(s);
                return s.empty();
            } else {
                return false;
            }
        }